

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O3

void getUnixString(char *to,int size,object *from)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = (uint)from->header;
  uVar3 = uVar1 >> 2;
  if (size <= (int)uVar3) {
    error_impl("getUnixString",0x256,"getUnixString(): String too long, %d, for buffer, %d bytes!",
               (ulong)uVar3,(ulong)(uint)size);
  }
  if (uVar1 < 4) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(uVar3 + (uVar3 == 0));
    uVar2 = 0;
    do {
      to[uVar2] = *(char *)((long)&from[1].header + uVar2);
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  to[uVar4] = '\0';
  return;
}

Assistant:

void getUnixString(char * to, int size, struct object * from)
{
    int i;
    int fsize = SIZE(from);
    struct byteObject * bobj = (struct byteObject *) from;

    if (fsize >= size) {
        error("getUnixString(): String too long, %d, for buffer, %d bytes!", fsize, size);
    }

    for (i = 0; i < fsize; i++) {
        to[i] = (char)bobj->bytes[i];
    }

    to[i] = '\0';	/* put null terminator at end */
}